

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int decode_new_session_ticket
              (ptls_t *tls,uint32_t *lifetime,uint32_t *age_add,ptls_iovec_t *nonce,
              ptls_iovec_t *ticket,uint32_t *max_early_data_size,uint8_t *src,uint8_t *end)

{
  uint8_t uVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  st_ptls_on_extension_t *psVar5;
  ushort uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  ulong uVar13;
  ptls_iovec_t pVar14;
  byte local_48 [8];
  uint8_t *local_40;
  uint8_t *local_38;
  
  iVar7 = 0x32;
  if (3 < (long)end - (long)src) {
    uVar4 = *(uint *)src;
    *lifetime = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    if (3 < ((long)end - (long)src) + -4) {
      uVar4 = *(uint *)(src + 4);
      *age_add = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      if (src + 8 != end) {
        puVar11 = src + 9;
        uVar10 = (ulong)src[8];
        if (uVar10 <= (ulong)((long)end - (long)puVar11)) {
          nonce->base = puVar11;
          nonce->len = uVar10;
          if (1 < (ulong)((long)end - (long)(puVar11 + uVar10))) {
            puVar11 = src + uVar10 + 0xb;
            uVar8 = (ulong)src[uVar10 + 9] * 0x100;
            uVar13 = (ulong)src[uVar10 + 10];
            if ((uVar8 + uVar13) - 1 < (ulong)((long)end - (long)puVar11)) {
              ticket->base = puVar11;
              ticket->len = uVar8 + uVar13;
              *max_early_data_size = 0;
              local_48[0] = 0x21;
              local_48[1] = 0x24;
              local_48[2] = 0x11;
              local_48[3] = 0;
              local_48[4] = 0;
              local_48[5] = 0x3a;
              local_48[6] = 8;
              local_48[7] = 0;
              if (1 < (ulong)((long)end - (long)(puVar11 + uVar8 + uVar13))) {
                lVar9 = (uVar8 | uVar13) + uVar10;
                uVar3 = *(ushort *)(puVar11 + uVar8 + uVar13);
                uVar10 = (ulong)(ushort)(uVar3 << 8 | uVar3 >> 8);
                puVar11 = src + lVar9 + 0xd;
                if (uVar10 <= (ulong)((long)end - (long)puVar11)) {
                  puVar12 = puVar11;
                  if (uVar10 != 0) {
                    puVar12 = src + uVar10 + lVar9 + 0xd;
                    local_40 = puVar12;
                    do {
                      if ((long)puVar12 - (long)puVar11 < 2) {
                        return 0x32;
                      }
                      uVar1 = *puVar11;
                      bVar2 = puVar11[1];
                      uVar3 = CONCAT11(uVar1,bVar2);
                      if (uVar3 < 0x40) {
                        if ((local_48[uVar3 >> 3] >> (uVar3 & 7) & 1) != 0) {
                          return 0x2f;
                        }
                        local_48[bVar2 >> 3] = local_48[bVar2 >> 3] | '\x01' << (bVar2 & 7);
                      }
                      if ((ulong)((long)puVar12 - (long)(puVar11 + 2)) < 2) {
                        return 0x32;
                      }
                      uVar6 = *(ushort *)(puVar11 + 2) << 8 | *(ushort *)(puVar11 + 2) >> 8;
                      if ((ulong)((long)puVar12 - (long)(puVar11 + 4)) < (ulong)uVar6) {
                        return 0x32;
                      }
                      psVar5 = tls->ctx->on_extension;
                      local_38 = puVar11;
                      if ((psVar5 != (st_ptls_on_extension_t *)0x0) &&
                         (pVar14.len._0_2_ = uVar6, pVar14.base = puVar11 + 4, pVar14.len._2_6_ = 0,
                         iVar7 = (*psVar5->cb)(psVar5,tls,'\x04',CONCAT11(uVar1,bVar2),pVar14),
                         puVar12 = local_40, iVar7 != 0)) {
                        return 1;
                      }
                      if (uVar3 == 0x2a) {
                        if (uVar6 < 4) {
                          return 0x32;
                        }
                        uVar4 = *(uint *)(local_38 + 4);
                        *max_early_data_size =
                             uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                             uVar4 << 0x18;
                        if (uVar6 != 4) {
                          return 0x32;
                        }
                        puVar11 = local_38 + 8;
                      }
                      else {
                        puVar11 = local_38 + (ulong)uVar6 + 4;
                      }
                    } while (puVar11 != puVar12);
                  }
                  iVar7 = 0x32;
                  if (puVar12 == end) {
                    iVar7 = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar7;
}

Assistant:

static int decode_new_session_ticket(ptls_t *tls, uint32_t *lifetime, uint32_t *age_add, ptls_iovec_t *nonce, ptls_iovec_t *ticket,
                                     uint32_t *max_early_data_size, const uint8_t *src, const uint8_t *const end)
{
    uint16_t exttype;
    int ret;

    if ((ret = ptls_decode32(lifetime, &src, end)) != 0)
        goto Exit;
    if ((ret = ptls_decode32(age_add, &src, end)) != 0)
        goto Exit;
    ptls_decode_open_block(src, end, 1, {
        *nonce = ptls_iovec_init(src, end - src);
        src = end;
    });
    ptls_decode_open_block(src, end, 2, {
        if (src == end) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        *ticket = ptls_iovec_init(src, end - src);
        src = end;
    });

    *max_early_data_size = 0;
    decode_extensions(src, end, PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET, &exttype, {
        if (tls->ctx->on_extension != NULL &&
            (ret = tls->ctx->on_extension->cb(tls->ctx->on_extension, tls, PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET, exttype,
                                              ptls_iovec_init(src, end - src)) != 0))
            goto Exit;
        switch (exttype) {
        case PTLS_EXTENSION_TYPE_EARLY_DATA:
            if ((ret = ptls_decode32(max_early_data_size, &src, end)) != 0)
                goto Exit;
            break;
        default:
            src = end;
            break;
        }
    });

    ret = 0;
Exit:
    return ret;
}